

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

void nn_node_term(nn_trie_node *self)

{
  ulong uVar1;
  ulong uVar2;
  
  if (self != (nn_trie_node *)0x0) {
    uVar1 = (ulong)self->type;
    if (8 < uVar1) {
      uVar1 = ((ulong)(self->u).sparse.children[1] - (ulong)(self->u).sparse.children[0]) + 1;
    }
    for (uVar2 = 0; (uVar1 & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
      nn_node_term(*(nn_trie_node **)(self[1].prefix + uVar2 * 8 + -6));
    }
    nn_free(self);
    return;
  }
  return;
}

Assistant:

void nn_node_term (struct nn_trie_node *self)
{
    int children;
    int i;

    /*  Trivial case of the recursive algorithm. */
    if (!self)
        return;

    /*  Recursively destroy the child nodes. */
    children = self->type <= NN_TRIE_SPARSE_MAX ?
        self->type : (self->u.dense.max - self->u.dense.min + 1);
    for (i = 0; i != children; ++i)
        nn_node_term (*nn_node_child (self, i));

    /*  Deallocate this node. */
    nn_free (self);
}